

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

void Fl::add_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *pCVar1;
  
  if (free_check == (Check *)0x0) {
    pCVar1 = (Check *)operator_new(0x18);
  }
  else {
    pCVar1 = free_check;
    free_check = free_check->next;
  }
  pCVar1->cb = cb;
  pCVar1->arg = argp;
  pCVar1->next = first_check;
  if (next_check == first_check) {
    next_check = pCVar1;
  }
  first_check = pCVar1;
  return;
}

Assistant:

void Fl::add_check(Fl_Timeout_Handler cb, void *argp) {
  Check* t = free_check;
  if (t) free_check = t->next;
  else t = new Check;
  t->cb = cb;
  t->arg = argp;
  t->next = first_check;
  if (next_check == first_check) next_check = t;
  first_check = t;
}